

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_masabl_node(REF_NODE ref_node)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL k1;
  REF_DBL c;
  REF_DBL hz;
  REF_DBL hx;
  REF_INT node;
  REF_NODE ref_node_local;
  
  hx._4_4_ = 0;
  do {
    if (ref_node->max <= hx._4_4_) {
      return 0;
    }
    if (((-1 < hx._4_4_) && (hx._4_4_ < ref_node->max)) && (-1 < ref_node->global[hx._4_4_])) {
      dVar2 = cos((ref_node->real[hx._4_4_ * 0xf] - 0.5) * 3.14159265358979);
      dVar2 = dVar2 * 0.2 + 0.01;
      dVar3 = exp(ref_node->real[hx._4_4_ * 0xf + 2] * 6.0);
      uVar1 = ref_node_metric_form
                        (ref_node,hx._4_4_,1.0 / (dVar2 * dVar2),0.0,0.0,99.99999999999999,0.0,
                         1.0 / (dVar3 * 0.001 * dVar3 * 0.001));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x160,"ref_metric_masabl_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    hx._4_4_ = hx._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_masabl_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL hx, hz, c, k1;

  each_ref_node_valid_node(ref_node, node) {
    hx =
        0.01 + 0.2 * cos(ref_math_pi * (ref_node_xyz(ref_node, 0, node) - 0.5));
    c = 0.001;
    k1 = 6.0;
    hz = c * exp(k1 * ref_node_xyz(ref_node, 2, node));
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (hx * hx), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (hz * hz)),
        "set node met");
  }

  return REF_SUCCESS;
}